

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_36::HttpEntityBodyReader::HttpEntityBodyReader
          (HttpEntityBodyReader *this,HttpInputStreamImpl *inner)

{
  HttpInputStreamImpl *inner_local;
  HttpEntityBodyReader *this_local;
  
  AsyncInputStream::AsyncInputStream(&this->super_AsyncInputStream);
  (this->super_AsyncInputStream)._vptr_AsyncInputStream = (_func_int **)&PTR_read_00d944a8;
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>::Maybe(&this->weakInner);
  this->finished = false;
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>::setCurrentWrapper
            (&inner->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>,
             &this->weakInner);
  return;
}

Assistant:

HttpEntityBodyReader(HttpInputStreamImpl& inner) {
    inner.setCurrentWrapper(weakInner);
  }